

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocketEngine_unix_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::TcpSocketEngine::nativeCreateSocket
          (TcpSocketEngine *this,NetworkProtocol protocol)

{
  int iVar1;
  int *piVar2;
  int in_ESI;
  int *in_RDI;
  int socketFd;
  int protocolNum;
  
  iVar1 = 2;
  if (in_ESI == 1) {
    iVar1 = 10;
  }
  iVar1 = socket(iVar1,1,6);
  if (0 < iVar1) {
    *in_RDI = iVar1;
    return true;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  if (iVar1 != 0xc) {
    if (iVar1 == 0xd) {
      in_RDI[0x13] = 3;
      std::__cxx11::string::operator=((string *)(in_RDI + 0x16),"permission denied");
      return false;
    }
    if (iVar1 == 0x16) {
LAB_002abda8:
      in_RDI[0x13] = 7;
      std::__cxx11::string::operator=((string *)(in_RDI + 0x16),"protocol not supported");
      return false;
    }
    if (1 < iVar1 - 0x17U) {
      if ((iVar1 == 0x5d) || (iVar1 == 0x61)) goto LAB_002abda8;
      if (iVar1 != 0x69) {
        return false;
      }
    }
  }
  in_RDI[0x13] = 4;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x16),"out of resources");
  return false;
}

Assistant:

bool TcpSocketEngine::nativeCreateSocket(HostAddress::NetworkProtocol protocol)
{

    // get protocol value for requested protocol type
    const int protocolNum = ((protocol == HostAddress::IPv6Protocol) ? AF_INET6 : AF_INET);

    // attempt to create socket
    int socketFd = socket(protocolNum, SOCK_STREAM, IPPROTO_TCP);

    // if we fetched an invalid socket descriptor
    if (socketFd <= 0) {

        // see what error we got
        switch (errno) {
            case EPROTONOSUPPORT:
            case EAFNOSUPPORT:
            case EINVAL:
                m_socketError = TcpSocket::UnsupportedSocketOperationError;
                m_errorString = "protocol not supported";
                break;
            case ENFILE:
            case EMFILE:
            case ENOBUFS:
            case ENOMEM:
                m_socketError = TcpSocket::SocketResourceError;
                m_errorString = "out of resources";
                break;
            case EACCES:
                m_socketError = TcpSocket::SocketAccessError;
                m_errorString = "permission denied";
                break;
            default:
                break;
        }

        // return failure
        return false;
    }

    // otherwise, store our socket FD & return success
    m_socketDescriptor = socketFd;
    return true;
}